

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaccard.cpp
# Opt level: O2

void duckdb::JaccardFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  value_type vVar2;
  value_type vVar3;
  double *pdVar4;
  undefined8 *puVar5;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat *pUVar7;
  ulong uVar8;
  idx_t i;
  long lVar9;
  VectorType VVar10;
  undefined8 in_R8;
  ValidityMask *in_R9;
  UnifiedVectorFormat *pUVar11;
  undefined8 *puVar12;
  UnifiedVectorFormat *pUVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t i_1;
  long lVar17;
  bool bVar18;
  double dVar19;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  idx_t in_stack_ffffffffffffff08;
  idx_t iVar20;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar10 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar10);
    pdVar4 = *(double **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      left.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = (*(undefined8 **)(vector_00 + 0x20))[1];
      dVar19 = BinaryLambdaWrapper::
               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                         ((Vector *)**(undefined8 **)(vector + 0x20),left,right,in_R9,
                          in_stack_ffffffffffffff08);
      *pdVar4 = dVar19;
      return;
    }
  }
  else {
    pUVar13 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar17 = *(long *)(vector + 0x20);
      puVar5 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar10);
        iVar20 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar12 = (undefined8 *)(lVar17 + 8);
          for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar13 != pUVar11; pUVar11 = pUVar11 + 1) {
            left_05.value.pointer.ptr = (char *)*puVar5;
            left_05.value._0_8_ = *puVar12;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = puVar5[1];
            dVar19 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               ((Vector *)puVar12[-1],left_05,right_05,in_R9,iVar20);
            *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
            puVar12 = puVar12 + 2;
          }
          return;
        }
        lVar17 = lVar17 + 8;
        uVar8 = 0;
        pUVar11 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(pUVar13 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar11 + 0x40;
            if (pUVar13 <= pUVar11 + 0x40) {
              pUVar6 = pUVar13;
            }
LAB_00798988:
            puVar12 = (undefined8 *)((long)pUVar11 * 0x10 + lVar17);
            for (; pUVar7 = pUVar11, pUVar11 < pUVar6; pUVar11 = pUVar11 + 1) {
              left_00.value.pointer.ptr = (char *)*puVar5;
              left_00.value._0_8_ = *puVar12;
              right_00.value.pointer.ptr = (char *)in_R8;
              right_00.value._0_8_ = puVar5[1];
              dVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 ((Vector *)puVar12[-1],left_00,right_00,in_R9,iVar20);
              *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
              puVar12 = puVar12 + 2;
            }
          }
          else {
            uVar15 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar11 + 0x40;
            if (pUVar13 <= pUVar11 + 0x40) {
              pUVar6 = pUVar13;
            }
            if (uVar15 == 0xffffffffffffffff) goto LAB_00798988;
            pUVar7 = pUVar6;
            if (uVar15 != 0) {
              lVar1 = iVar20 + (long)pUVar11 * 8;
              puVar12 = (undefined8 *)((long)pUVar11 * 0x10 + lVar17);
              for (uVar14 = 0; pUVar7 = pUVar11 + uVar14, pUVar11 + uVar14 < pUVar6;
                  uVar14 = uVar14 + 1) {
                if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*puVar5;
                  left_01.value._0_8_ = *puVar12;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = puVar5[1];
                  dVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     ((Vector *)puVar12[-1],left_01,right_01,in_R9,iVar20);
                  *(double *)(lVar1 + uVar14 * 8) = dVar19;
                }
                puVar12 = puVar12 + 2;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar11 = pUVar7;
        } while( true );
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar17 = *(long *)(vector + 0x20);
          lVar1 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar10);
          iVar20 = *(idx_t *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar9 = 0;
            while (bVar18 = pUVar13 != (UnifiedVectorFormat *)0x0, pUVar13 = pUVar13 + -1, bVar18) {
              left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar1 + lVar9 * 2);
              left_10.value._0_8_ = *(undefined8 *)(lVar17 + 8 + lVar9 * 2);
              right_10.value.pointer.ptr = (char *)in_R8;
              right_10.value._0_8_ = *(undefined8 *)(lVar1 + 8 + lVar9 * 2);
              dVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)(lVar17 + lVar9 * 2),left_10,right_10,in_R9,iVar20);
              *(double *)(iVar20 + lVar9) = dVar19;
              lVar9 = lVar9 + 8;
            }
          }
          else {
            pUVar11 = (UnifiedVectorFormat *)0x0;
            for (uVar8 = 0; uVar8 != (ulong)(pUVar13 + 0x3f) >> 6; uVar8 = uVar8 + 1) {
              lVar9 = *(long *)(result + 0x28);
              if (lVar9 == 0) {
                pUVar6 = pUVar11 + 0x40;
                if (pUVar13 <= pUVar11 + 0x40) {
                  pUVar6 = pUVar13;
                }
LAB_00798de2:
                uVar15 = (long)pUVar11 << 4 | 8;
                for (; pUVar7 = pUVar11, pUVar11 < pUVar6; pUVar11 = pUVar11 + 1) {
                  left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar1 + -8 + uVar15);
                  left_06.value._0_8_ = *(undefined8 *)(lVar17 + uVar15);
                  right_06.value.pointer.ptr = (char *)in_R8;
                  right_06.value._0_8_ = *(undefined8 *)(lVar1 + uVar15);
                  dVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)(lVar17 + -8 + uVar15),left_06,right_06,in_R9,
                                      iVar20);
                  *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
                  uVar15 = uVar15 + 0x10;
                }
              }
              else {
                uVar15 = *(ulong *)(lVar9 + uVar8 * 8);
                pUVar6 = pUVar11 + 0x40;
                if (pUVar13 <= pUVar11 + 0x40) {
                  pUVar6 = pUVar13;
                }
                if (uVar15 == 0xffffffffffffffff) goto LAB_00798de2;
                pUVar7 = pUVar6;
                if (uVar15 != 0) {
                  lVar9 = iVar20 + (long)pUVar11 * 8;
                  uVar16 = (long)pUVar11 << 4 | 8;
                  for (uVar14 = 0; pUVar7 = pUVar11 + uVar14, pUVar11 + uVar14 < pUVar6;
                      uVar14 = uVar14 + 1) {
                    if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar1 + -8 + uVar16);
                      left_07.value._0_8_ = *(undefined8 *)(lVar17 + uVar16);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(lVar1 + uVar16);
                      dVar19 = BinaryLambdaWrapper::
                               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                         (*(Vector **)(lVar17 + -8 + uVar16),left_07,right_07,in_R9,
                                          iVar20);
                      *(double *)(lVar9 + uVar14 * 8) = dVar19;
                    }
                    uVar16 = uVar16 + 0x10;
                  }
                }
              }
              pUVar11 = pUVar7;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar13);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar13);
          duckdb::Vector::SetVectorType(VVar10);
          iVar20 = *(idx_t *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar13 != pUVar11; pUVar11 = pUVar11 + 1) {
              pUVar6 = pUVar11;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar11 * 4);
              }
              pUVar7 = pUVar11;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar11 * 4);
              }
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar7 * 0x10);
              left_02.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
              right_02.value.pointer.ptr = (char *)in_R8;
              right_02.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar7 * 0x10);
              dVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)(local_70 + (long)pUVar6 * 0x10),left_02,right_02,
                                  in_R9,iVar20);
              *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
            }
          }
          else {
            for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar13 != pUVar11; pUVar11 = pUVar11 + 1) {
              pUVar6 = pUVar11;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar11 * 4);
              }
              pUVar7 = pUVar11;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar11 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar6 >> 6) * 8) >> ((ulong)pUVar6 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1)
                   != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar7 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar7 * 0x10);
                dVar19 = BinaryLambdaWrapper::
                         Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                   (*(Vector **)(local_70 + (long)pUVar6 * 0x10),left_08,right_08,
                                    in_R9,iVar20);
                *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar11);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar5 = *(undefined8 **)(vector + 0x20);
      lVar17 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar10);
        iVar20 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar12 = (undefined8 *)(lVar17 + 8);
          for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar13 != pUVar11; pUVar11 = pUVar11 + 1) {
            left_09.value.pointer.ptr = (char *)puVar12[-1];
            left_09.value._0_8_ = puVar5[1];
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *puVar12;
            dVar19 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               ((Vector *)*puVar5,left_09,right_09,in_R9,iVar20);
            *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
            puVar12 = puVar12 + 2;
          }
          return;
        }
        lVar17 = lVar17 + 8;
        uVar8 = 0;
        pUVar11 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(pUVar13 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar11 + 0x40;
            if (pUVar13 <= pUVar11 + 0x40) {
              pUVar6 = pUVar13;
            }
LAB_00798c1f:
            puVar12 = (undefined8 *)((long)pUVar11 * 0x10 + lVar17);
            for (; pUVar7 = pUVar11, pUVar11 < pUVar6; pUVar11 = pUVar11 + 1) {
              left_03.value.pointer.ptr = (char *)puVar12[-1];
              left_03.value._0_8_ = puVar5[1];
              right_03.value.pointer.ptr = (char *)in_R8;
              right_03.value._0_8_ = *puVar12;
              dVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 ((Vector *)*puVar5,left_03,right_03,in_R9,iVar20);
              *(double *)(iVar20 + (long)pUVar11 * 8) = dVar19;
              puVar12 = puVar12 + 2;
            }
          }
          else {
            uVar15 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar11 + 0x40;
            if (pUVar13 <= pUVar11 + 0x40) {
              pUVar6 = pUVar13;
            }
            if (uVar15 == 0xffffffffffffffff) goto LAB_00798c1f;
            pUVar7 = pUVar6;
            if (uVar15 != 0) {
              lVar1 = iVar20 + (long)pUVar11 * 8;
              puVar12 = (undefined8 *)((long)pUVar11 * 0x10 + lVar17);
              for (uVar14 = 0; pUVar7 = pUVar11 + uVar14, pUVar11 + uVar14 < pUVar6;
                  uVar14 = uVar14 + 1) {
                if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)puVar12[-1];
                  left_04.value._0_8_ = puVar5[1];
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *puVar12;
                  dVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     ((Vector *)*puVar5,left_04,right_04,in_R9,iVar20);
                  *(double *)(lVar1 + uVar14 * 8) = dVar19;
                }
                puVar12 = puVar12 + 2;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar11 = pUVar7;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar10);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void JaccardFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, double>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return JaccardScalarFunction(result, str, tgt); });
}